

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O3

void __thiscall
gui::MultilineTextBox::handleMousePress(MultilineTextBox *this,Button button,Vector2f *mouseParent)

{
  Vector2f VVar1;
  Transform *this_00;
  Vector2f *pVVar2;
  size_t caretOffset;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector2f mouseLocal;
  Vector2f local_40;
  undefined1 local_38 [16];
  Vector2<unsigned_long> local_28;
  
  Widget::handleMousePress(&this->super_Widget,button,mouseParent);
  this_00 = Widget::getInverseTransform(&this->super_Widget);
  VVar1 = sf::Transform::transformPoint(this_00,mouseParent);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_4_ = VVar1.x;
  local_38._4_4_ = VVar1.y;
  local_38._12_4_ = extraout_XMM0_Dd;
  pVVar2 = Widget::getOrigin(&this->super_Widget);
  local_40.y = (float)local_38._4_4_ - (*pVVar2).y;
  local_40.x = (float)local_38._0_4_ - (*pVVar2).x;
  if (button == Left) {
    caretOffset = findClosestOffsetToMouse(this,&local_40);
    local_28 = findCaretPosition(this,caretOffset);
    updateCaretPosition(this,&local_28,false);
  }
  else if (2 < (int)button) goto LAB_001447da;
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
            (&this->onClick,&this->super_Widget,&local_40);
LAB_001447da:
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (&this->onMousePress,&this->super_Widget,button,&local_40);
  return;
}

Assistant:

void MultilineTextBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left) {
        updateCaretPosition(findClosestOffsetToMouse(mouseLocal), false);
    }
    if (button <= sf::Mouse::Middle) {
        onClick.emit(this, mouseLocal);
    }
    onMousePress.emit(this, button, mouseLocal);
}